

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O0

void llvm::yaml::MappingTraits<llvm::DWARFYAML::ARange>::mapping(IO *IO,ARange *Range)

{
  ARange *Range_local;
  IO *IO_local;
  
  yaml::IO::mapRequired<llvm::DWARFYAML::InitialLength>(IO,"Length",&Range->Length);
  yaml::IO::mapRequired<unsigned_short>(IO,"Version",&Range->Version);
  yaml::IO::mapRequired<unsigned_int>(IO,"CuOffset",&Range->CuOffset);
  yaml::IO::mapRequired<unsigned_char>(IO,"AddrSize",&Range->AddrSize);
  yaml::IO::mapRequired<unsigned_char>(IO,"SegSize",&Range->SegSize);
  yaml::IO::
  mapRequired<std::vector<llvm::DWARFYAML::ARangeDescriptor,std::allocator<llvm::DWARFYAML::ARangeDescriptor>>>
            (IO,"Descriptors",&Range->Descriptors);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::ARange>::mapping(IO &IO,
                                               DWARFYAML::ARange &Range) {
  IO.mapRequired("Length", Range.Length);
  IO.mapRequired("Version", Range.Version);
  IO.mapRequired("CuOffset", Range.CuOffset);
  IO.mapRequired("AddrSize", Range.AddrSize);
  IO.mapRequired("SegSize", Range.SegSize);
  IO.mapRequired("Descriptors", Range.Descriptors);
}